

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

ON_MappingChannel * __thiscall
ON_ObjectRenderingAttributes::MappingChannel
          (ON_ObjectRenderingAttributes *this,ON_UUID *plugin_id,int mapping_channel_id)

{
  bool bVar1;
  ON_MappingChannel *pOVar2;
  int iVar3;
  bool bVar4;
  
  pOVar2 = (ON_MappingChannel *)MappingRef(this,plugin_id);
  if (pOVar2 != (ON_MappingChannel *)0x0) {
    iVar3 = *(int *)((long)&pOVar2->m_object_xform + 8);
    if (iVar3 < 1) {
      bVar1 = true;
    }
    else {
      pOVar2 = *(ON_MappingChannel **)&pOVar2->m_object_xform;
      do {
        bVar4 = pOVar2->m_mapping_channel_id == mapping_channel_id;
        bVar1 = !bVar4;
        if (bVar4) break;
        pOVar2 = pOVar2 + 1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    if (!bVar1) {
      return pOVar2;
    }
  }
  return (ON_MappingChannel *)0x0;
}

Assistant:

const ON_MappingChannel* ON_ObjectRenderingAttributes::MappingChannel(
  const ON_UUID& plugin_id,
  int mapping_channel_id
  ) const
{
  const ON_MappingRef* mr = MappingRef(plugin_id);
  if ( mr )
  {
    int count;
    if ( (count = mr->m_mapping_channels.Count()) > 0 )
    {
      for ( const ON_MappingChannel* mc = mr->m_mapping_channels.Array(); count--; mc++ )
      {
        if ( mapping_channel_id == mc->m_mapping_channel_id )
          return mc;
      }
    }
  }
  return 0;
}